

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O3

uint32_t icu_63::util64_tou(int64_t w,UChar *buf,uint32_t len,uint32_t radix,UBool raw)

{
  long lVar1;
  UChar *pUVar2;
  UChar *pUVar3;
  UChar UVar4;
  ulong uVar5;
  UChar *pUVar6;
  UChar *pUVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar5 = 2;
  if (2 < radix) {
    uVar5 = (ulong)radix;
  }
  uVar8 = 0x24;
  if ((uint)uVar5 < 0x24) {
    uVar8 = uVar5;
  }
  if ((((raw == '\0') && (len != 0)) && (w < 0)) && (radix == 10)) {
    w = -w;
    *buf = L'-';
    len = len - 1;
    pUVar3 = buf + 1;
LAB_00254154:
    bVar9 = len != 0;
    if (w != 0 && bVar9) {
      do {
        len = len - 1;
        lVar1 = w / (long)uVar8;
        uVar5 = w % (long)uVar8;
        if (raw == '\0') {
          uVar5 = (ulong)(byte)asciiDigits[(int)uVar5];
        }
        *pUVar3 = (UChar)uVar5;
        pUVar3 = pUVar3 + 1;
        bVar9 = len != 0;
      } while ((bVar9) && (w = lVar1, lVar1 != 0));
    }
    if (!bVar9) goto LAB_002541a4;
  }
  else {
    pUVar3 = buf;
    if (w != 0 || len == 0) goto LAB_00254154;
    UVar4 = L'0';
    if (raw != '\0') {
      UVar4 = L'\0';
    }
    pUVar3 = buf + 1;
    *buf = UVar4;
    if (len == 1) goto LAB_002541a4;
  }
  *pUVar3 = L'\0';
LAB_002541a4:
  uVar5 = (ulong)((uint)(*buf == L'-') * 2);
  pUVar2 = pUVar3 + -1;
  if ((UChar *)((long)buf + uVar5) < pUVar2) {
    pUVar7 = (UChar *)(uVar5 + (long)buf);
    do {
      pUVar6 = pUVar7 + 1;
      UVar4 = *pUVar2;
      *pUVar2 = *pUVar7;
      *pUVar7 = UVar4;
      pUVar2 = pUVar2 + -1;
      pUVar7 = pUVar6;
    } while (pUVar6 < pUVar2);
  }
  return (uint32_t)((ulong)((long)pUVar3 - (long)buf) >> 1);
}

Assistant:

uint32_t util64_tou(int64_t w, UChar* buf, uint32_t len, uint32_t radix, UBool raw)
{    
    if (radix > 36) {
        radix = 36;
    } else if (radix < 2) {
        radix = 2;
    }
    int64_t base = radix;

    UChar* p = buf;
    if (len && (w < 0) && (radix == 10) && !raw) {
        w = -w;
        *p++ = kUMinus;
        --len;
    } else if (len && (w == 0)) {
        *p++ = (UChar)raw ? 0 : asciiDigits[0];
        --len;
    }

    while (len && (w != 0)) {
        int64_t n = w / base;
        int64_t m = n * base;
        int32_t d = (int32_t)(w-m);
        *p++ = (UChar)(raw ? d : asciiDigits[d]);
        w = n;
        --len;
    }
    if (len) {
        *p = 0; // null terminate if room for caller convenience
    }

    len = (uint32_t)(p - buf);
    if (*buf == kUMinus) {
        ++buf;
    }
    while (--p > buf) {
        UChar c = *p;
        *p = *buf;
        *buf = c;
        ++buf;
    }

    return len;
}